

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

int __thiscall ON_MorphControl::CVCount(ON_MorphControl *this)

{
  int iVar1;
  int local_14;
  int rc;
  ON_MorphControl *this_local;
  
  local_14 = 0;
  iVar1 = this->m_varient;
  if (iVar1 == 1) {
    local_14 = ON_NurbsCurve::CVCount(&this->m_nurbs_curve);
  }
  else if (iVar1 == 2) {
    local_14 = ON_NurbsSurface::CVCount(&this->m_nurbs_surface);
  }
  else if (iVar1 == 3) {
    local_14 = ON_NurbsCage::CVCount(&this->m_nurbs_cage);
  }
  return local_14;
}

Assistant:

int ON_MorphControl::CVCount() const
{
  int rc = 0;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.CVCount();
    break;
  case 2:
    rc = m_nurbs_surface.CVCount();
    break;
  case 3:
    rc = m_nurbs_cage.CVCount();
    break;
  }
  return rc;
}